

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::php::anon_unknown_2::ConstantNamePrefix
          (string *__return_storage_ptr__,anon_unknown_2 *this,string *classname)

{
  undefined1 *puVar1;
  ulong uVar2;
  int iVar3;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar4;
  string *extraout_RAX_01;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  string lower;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,this,this + (long)&classname->_M_dataplus);
  puVar1 = local_50;
  if (local_48 != 0) {
    lVar6 = 0;
    do {
      iVar3 = tolower((int)(char)puVar1[lVar6]);
      puVar1[lVar6] = (char)iVar3;
      lVar6 = lVar6 + 1;
    } while (local_48 != lVar6);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar3 == 0) {
    bVar7 = true;
  }
  else {
    uVar2 = 0;
    do {
      uVar5 = uVar2;
      if (uVar5 == 0x4c) break;
      iVar3 = std::__cxx11::string::compare((char *)&local_50);
      uVar2 = uVar5 + 1;
    } while (iVar3 != 0);
    bVar7 = uVar5 < 0x4c;
  }
  lVar6 = 0;
  do {
    iVar3 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar3 == 0) goto LAB_0027a543;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x24);
  if (bVar7) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"PB","");
    psVar4 = extraout_RAX;
  }
  else {
LAB_0027a543:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    psVar4 = extraout_RAX_00;
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
    psVar4 = extraout_RAX_01;
  }
  return psVar4;
}

Assistant:

std::string ConstantNamePrefix(const std::string& classname) {
  bool is_reserved = false;

  std::string lower = classname;
  std::transform(lower.begin(), lower.end(), lower.begin(), ::tolower);

  for (int i = 0; i < kReservedNamesSize; i++) {
    if (lower == kReservedNames[i]) {
      is_reserved = true;
      break;
    }
  }

  for (int i = 0; i < kValidConstantNamesSize; i++) {
    if (lower == kValidConstantNames[i]) {
      is_reserved = false;
      break;
    }
  }

  if (is_reserved) {
    return "PB";
  }

  return "";
}